

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationMaxInOut::initReferenceValues
          (TessellationShaderTessellationMaxInOut *this)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  GLfloat *pGVar4;
  ResourceError *this_00;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  GLfloat sumInTCS [4];
  GLfloat sumInTES [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar14;
  
  local_68._8_8_ = local_68._0_8_;
  uVar5 = this->m_gl_max_tess_control_input_components_value;
  uVar9 = this->m_gl_max_tess_control_output_components_value;
  uVar6 = this->m_gl_max_tess_evaluation_input_components_value;
  uVar2 = this->m_gl_max_tess_evaluation_output_components_value;
  uVar10 = uVar2;
  if ((int)uVar2 < (int)uVar6) {
    uVar10 = uVar6;
  }
  if ((int)uVar10 < (int)uVar9) {
    uVar10 = uVar9;
  }
  if ((int)uVar10 < (int)uVar5) {
    uVar10 = uVar5;
  }
  pGVar4 = (GLfloat *)malloc((long)(int)uVar10 << 2);
  this->m_ref_vertex_attributes = pGVar4;
  auVar3 = _DAT_019f5ce0;
  if (pGVar4 == (GLfloat *)0x0) {
    this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
    local_68._0_8_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Unable to allocate memory!","");
    tcu::ResourceError::ResourceError(this_00,(string *)local_68);
    __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_68 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  uVar10 = uVar5 - 4;
  if (0 < (int)uVar10) {
    lVar14 = (ulong)uVar10 - 1;
    auVar11._8_4_ = (int)lVar14;
    auVar11._0_8_ = lVar14;
    auVar11._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_019f5ce0;
    auVar13 = _DAT_019fcc00;
    do {
      auVar17 = auVar13 ^ auVar3;
      if ((bool)(~(auVar17._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar17._0_4_ ||
                  auVar11._4_4_ < auVar17._4_4_) & 1)) {
        pGVar4[uVar7] = (float)(int)uVar7;
      }
      if ((auVar17._12_4_ != auVar11._12_4_ || auVar17._8_4_ <= auVar11._8_4_) &&
          auVar17._12_4_ <= auVar11._12_4_) {
        pGVar4[uVar7 + 1] = (float)((int)uVar7 + 1);
      }
      uVar7 = uVar7 + 2;
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
    } while ((uVar5 - 3 & 0xfffffffe) != uVar7);
    if (0 < (int)uVar10) {
      uVar7 = 0;
      do {
        uVar8 = (ulong)((uint)uVar7 & 3);
        *(float *)(local_68 + uVar8 * 4) = pGVar4[uVar7] + *(float *)(local_68 + uVar8 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
  }
  uVar1 = uVar9 - 4;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pGVar4[uVar7] = (float)(int)(uint)uVar7 + *(float *)(local_68 + (ulong)((uint)uVar7 & 3) * 4);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  auVar13 = _DAT_019fcc00;
  auVar3 = _DAT_019f5ce0;
  if ((int)uVar10 < (int)uVar1) {
    uVar9 = uVar9 + ~uVar5;
    auVar17._4_4_ = 0;
    auVar17._0_4_ = uVar9;
    auVar17._8_4_ = uVar9;
    auVar17._12_4_ = 0;
    uVar7 = 0;
    auVar17 = auVar17 ^ _DAT_019f5ce0;
    uVar5 = uVar10;
    do {
      auVar15._8_4_ = (int)uVar7;
      auVar15._0_8_ = uVar7;
      auVar15._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar15 | auVar13) ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar11._0_4_ ||
                  auVar17._4_4_ < auVar11._4_4_) & 1)) {
        pGVar4[(long)(int)uVar10 + uVar7] = (float)(int)uVar5;
      }
      if ((auVar11._12_4_ != auVar17._12_4_ || auVar11._8_4_ <= auVar17._8_4_) &&
          auVar11._12_4_ <= auVar17._12_4_) {
        pGVar4[(long)(int)uVar10 + uVar7 + 1] = (float)(int)(uVar5 + 1);
      }
      uVar7 = uVar7 + 2;
      uVar5 = uVar5 + 2;
    } while (((ulong)uVar9 + 2 & 0xfffffffffffffffe) != uVar7);
  }
  uVar5 = uVar6 - 4;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      uVar8 = (ulong)((uint)uVar7 & 3);
      *(float *)(local_48 + uVar8 * 4) = pGVar4[uVar7] + *(float *)(local_48 + uVar8 * 4);
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  uVar9 = uVar2 - 4;
  if (0 < (int)uVar9) {
    uVar7 = 0;
    do {
      pGVar4[uVar7] = (float)(int)(uint)uVar7 + *(float *)(local_48 + (ulong)((uint)uVar7 & 3) * 4);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  auVar13 = _DAT_019fcc00;
  auVar3 = _DAT_019f5ce0;
  if ((int)uVar5 < (int)uVar9) {
    uVar10 = ~uVar6 + uVar2;
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar10;
    auVar12._8_4_ = uVar10;
    auVar12._12_4_ = 0;
    uVar7 = 0;
    auVar12 = auVar12 ^ _DAT_019f5ce0;
    uVar6 = uVar5;
    do {
      auVar16._8_4_ = (int)uVar7;
      auVar16._0_8_ = uVar7;
      auVar16._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar16 | auVar13) ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar11._0_4_ ||
                  auVar12._4_4_ < auVar11._4_4_) & 1)) {
        pGVar4[(long)(int)uVar5 + uVar7] = (float)(int)uVar6;
      }
      if ((auVar11._12_4_ != auVar12._12_4_ || auVar11._8_4_ <= auVar12._8_4_) &&
          auVar11._12_4_ <= auVar12._12_4_) {
        pGVar4[(long)(int)uVar5 + uVar7 + 1] = (float)(int)(uVar6 + 1);
      }
      uVar7 = uVar7 + 2;
      uVar6 = uVar6 + 2;
    } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar7);
  }
  uVar6 = 0;
  pGVar4[(int)uVar9] = 0.0;
  pGVar4[(int)(uVar2 - 3)] = 0.0;
  pGVar4[(int)(uVar2 - 2)] = 0.0;
  pGVar4[(int)(uVar2 - 1)] = 1.0;
  this->m_ref_patch_attributes[0] = 0.0;
  this->m_ref_patch_attributes[1] = 0.0;
  this->m_ref_patch_attributes[2] = 0.0;
  this->m_ref_patch_attributes[3] = 0.0;
  uVar5 = this->m_gl_max_tess_patch_components_value;
  if (0 < (int)uVar5) {
    do {
      this->m_ref_patch_attributes[uVar6 & 3] =
           (float)(int)uVar6 + this->m_ref_patch_attributes[uVar6 & 3];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void TessellationShaderTessellationMaxInOut::initReferenceValues(void)
{
	/* Allocate vertex attribute array data needed for reference values preparation. */
	int max_array_size = de::max(m_gl_max_tess_control_input_components_value,
								 de::max(m_gl_max_tess_control_output_components_value,
										 de::max(m_gl_max_tess_evaluation_input_components_value,
												 m_gl_max_tess_evaluation_output_components_value)));

	m_ref_vertex_attributes = (glw::GLfloat*)malloc(sizeof(glw::GLfloat) * (max_array_size));
	if (m_ref_vertex_attributes == DE_NULL)
	{
		throw tcu::ResourceError("Unable to allocate memory!");
	}

	/* We need to create an array consisting of gl_max_tess_evaluation_output_components items.
	 * The array will be filled with the following values:
	 *
	 * reference_value[0],
	 * (...)
	 * reference_value[gl_max_tess_evaluation_output_components / 4 - 2],
	 * reference_gl_Position
	 *
	 * which corresponds to output block defined for Tessellation Evaluation Stage:
	 *
	 * out Vertex
	 * {
	 *     vec4 value[(gl_MaxTessControlInputComponents) / 4 - 1];
	 * } outVertex;
	 *
	 * + gl_Position.
	 */
	glw::GLfloat sumInTCS[] = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLfloat sumInTES[] = { 0.0f, 0.0f, 0.0f, 0.0f };

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTCS[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_control_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTCS[i % 4] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_control_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_control_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i++)
	{
		sumInTES[i % 4 /* component selector */] += m_ref_vertex_attributes[i];
	}

	for (int i = 0; i < m_gl_max_tess_evaluation_output_components_value - 4; /* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = sumInTES[i % 4 /* component selector */] + (glw::GLfloat)i;
	}

	for (int i = m_gl_max_tess_evaluation_input_components_value - 4; /* gl_Position */
		 i < m_gl_max_tess_evaluation_output_components_value - 4;	/* gl_Position */
		 i++)
	{
		m_ref_vertex_attributes[i] = (glw::GLfloat)i;
	}

	/* Store gl_Position reference values (only first vertex will be compared) */
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 4] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 3] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 2] = 0.0f;
	m_ref_vertex_attributes[m_gl_max_tess_evaluation_output_components_value - 1] = 1.0f;

	/* Set up reference data for case 2
	 *
	 * Only one output vector will be needed for comparison.
	 */
	m_ref_patch_attributes[0] = 0.0f;
	m_ref_patch_attributes[1] = 0.0f;
	m_ref_patch_attributes[2] = 0.0f;
	m_ref_patch_attributes[3] = 0.0f;

	for (int i = 0; i < m_gl_max_tess_patch_components_value; i++)
	{
		m_ref_patch_attributes[i % 4] += (glw::GLfloat)i;
	}
}